

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<_duckdb_logical_type_*const_&,__duckdb_logical_type_*const_&> * __thiscall
Catch::ExprLhs<_duckdb_logical_type*const&>::operator!=
          (ExprLhs<_duckdb_logical_type_*const_&> *this,_duckdb_logical_type **rhs)

{
  StringRef op;
  bool comparisonResult;
  _duckdb_logical_type **in_RDX;
  _duckdb_logical_type **in_RSI;
  BinaryExpr<_duckdb_logical_type_*const_&,__duckdb_logical_type_*const_&> *in_RDI;
  _duckdb_logical_type **in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  _duckdb_logical_type *p_Var1;
  BinaryExpr<_duckdb_logical_type_*const_&,__duckdb_logical_type_*const_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareNotEqual<_duckdb_logical_type*,_duckdb_logical_type*const&>
                 ((_duckdb_logical_type **)*in_RSI,in_RDX);
  p_Var1 = *in_RSI;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = (char *)p_Var1;
  BinaryExpr<_duckdb_logical_type_*const_&,__duckdb_logical_type_*const_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }